

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O2

void Color::print_info(string *out,bool important)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Modifier local_1c;
  Modifier local_18;
  Modifier local_14;
  
  local_1c.code = RESET;
  local_18.code = BOLD;
  local_14.code = FG_GREEN;
  poVar1 = operator<<((ostream *)&std::cout,&local_14);
  if ((int)CONCAT71(in_register_00000031,important) == 0) {
    poVar1 = std::operator<<(poVar1,"[------------] ");
    poVar1 = operator<<(poVar1,&local_1c);
    poVar1 = std::operator<<(poVar1,(string *)out);
  }
  else {
    poVar1 = operator<<(poVar1,&local_18);
    poVar1 = std::operator<<(poVar1,"[------------] ");
    poVar1 = std::operator<<(poVar1,(string *)out);
    poVar1 = operator<<(poVar1,&local_1c);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

inline void print_info(const std::string &out, bool important = false) {
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  if (!important) {
    std::cout << green << "[------------] " << reset << out << std::endl;
  } else {
    std::cout << green << bold << "[------------] " << out << reset << std::endl;
  }
}